

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O3

void __thiscall
ot::commissioner::DtlsSession::HandleMbedtlsExportKeys
          (DtlsSession *this,mbedtls_ssl_key_export_type aType,uchar *aMasterSecret,
          size_t aMasterSecretLen,uchar *aClientRandom,uchar *aServerRandom,
          mbedtls_tls_prf_types aTlsPrfType)

{
  char *pcVar1;
  ByteArray *this_00;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar2;
  format_args args;
  string local_188;
  string local_168;
  Sha256 sha256;
  uchar keyBlock [40];
  format_string_checker<char> local_a8;
  uchar randBytes [64];
  
  Sha256::Sha256(&sha256);
  if ((aType == MBEDTLS_SSL_KEY_EXPORT_TLS12_MASTER_SECRET) &&
     ((this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    randBytes._0_8_ = *(undefined8 *)aServerRandom;
    randBytes._8_8_ = *(undefined8 *)(aServerRandom + 8);
    randBytes._16_8_ = *(undefined8 *)(aServerRandom + 0x10);
    randBytes._24_8_ = *(undefined8 *)(aServerRandom + 0x18);
    randBytes._32_8_ = *(undefined8 *)aClientRandom;
    randBytes._40_8_ = *(undefined8 *)(aClientRandom + 8);
    randBytes._48_8_ = *(undefined8 *)(aClientRandom + 0x10);
    randBytes._56_8_ = *(undefined8 *)(aClientRandom + 0x18);
    aVar2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
             )0x40;
    mbedtls_ssl_tls_prf(aTlsPrfType,aMasterSecret,aMasterSecretLen,"key expansion",randBytes,0x40,
                        keyBlock,0x28);
    Sha256::Start(&sha256);
    Sha256::Update(&sha256,keyBlock,0x28);
    this_00 = &this->mKek;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x20);
    Sha256::Finish(&sha256,(this_00->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x10);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"dtls","");
    local_a8.types_[0] = none_type;
    local_a8.context_.super_basic_format_parse_context<char>.format_str_.data_ = "Generated KEK";
    local_a8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0xd;
    local_a8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_a8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_a8.parse_funcs_[0] = (parse_func)0x0;
    begin = "Generated KEK";
    local_a8.context_.types_ = local_a8.types_;
    do {
      pcVar1 = begin + 1;
      if (*begin == '}') {
        if ((pcVar1 == "") || (*pcVar1 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar1 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar1 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_a8);
      }
      begin = pcVar1;
    } while (pcVar1 != "");
    args.field_1.args_ = aVar2.args_;
    args.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v10::vformat_abi_cxx11_(&local_168,(v10 *)"Generated KEK",(string_view)ZEXT816(0xd),args)
    ;
    Log(kDebug,&local_188,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
  }
  Sha256::~Sha256(&sha256);
  return;
}

Assistant:

void DtlsSession::HandleMbedtlsExportKeys(mbedtls_ssl_key_export_type aType,
                                          const unsigned char        *aMasterSecret,
                                          size_t                      aMasterSecretLen,
                                          const unsigned char         aClientRandom[32],
                                          const unsigned char         aServerRandom[32],
                                          mbedtls_tls_prf_types       aTlsPrfType)
{
    Sha256        sha256;
    unsigned char keyBlock[kKeyBlockSize];
    unsigned char randBytes[2 * kRandomBufferSize];

    VerifyOrExit(!mPSK.empty());
    VerifyOrExit(aType == MBEDTLS_SSL_KEY_EXPORT_TLS12_MASTER_SECRET);

    memcpy(randBytes, aServerRandom, kRandomBufferSize);
    memcpy(randBytes + kRandomBufferSize, aClientRandom, kRandomBufferSize);

    // Retrieve the Key block from Master secret
    mbedtls_ssl_tls_prf(aTlsPrfType, aMasterSecret, aMasterSecretLen, "key expansion", randBytes, sizeof(randBytes),
                        keyBlock, sizeof(keyBlock));

    sha256.Start();
    sha256.Update(keyBlock, kKeyBlockSize);

    mKek.resize(Sha256::kHashSize);
    sha256.Finish(mKek.data());

    static_assert(Sha256::kHashSize >= kJoinerRouterKekLength, "Sha256::kHashSize >= kJoinerRouterKekLength");
    mKek.resize(kJoinerRouterKekLength);

    LOG_DEBUG(LOG_REGION_DTLS, "Generated KEK");

exit:;
}